

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-literal.cc
# Opt level: O0

void anon_unknown.dwarf_714a8::AssertHexDoubleFails(char *s)

{
  bool bVar1;
  size_t sVar2;
  Message *message;
  char *message_00;
  AssertHelper local_40;
  Message local_38;
  Result local_30;
  Enum local_2c;
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  uint64_t actual_bits;
  char *s_local;
  
  local_2c = Error;
  actual_bits = (uint64_t)s;
  sVar2 = strlen(s);
  local_30 = wabt::ParseDouble(Hexfloat,s,s + sVar2,(uint64_t *)&gtest_ar.message_);
  testing::internal::EqHelper::Compare<wabt::Result::Enum,_wabt::Result,_nullptr>
            ((EqHelper *)local_28,"Result::Error",
             "ParseDouble(LiteralType::Hexfloat, s, s + strlen(s), &actual_bits)",&local_2c,
             &local_30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(&local_38);
    message = testing::Message::operator<<(&local_38,(char **)&actual_bits);
    message_00 = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/test-literal.cc"
               ,0xb8,message_00);
    testing::internal::AssertHelper::operator=(&local_40,message);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::Message::~Message(&local_38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  return;
}

Assistant:

void AssertHexDoubleFails(const char* s) {
  uint64_t actual_bits;
  ASSERT_EQ(Result::Error,
            ParseDouble(LiteralType::Hexfloat, s, s + strlen(s), &actual_bits))
      << s;
}